

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Rml::Context::PushDocumentToBack(Context *this,ElementDocument *document)

{
  int iVar1;
  int iVar2;
  pointer pEVar3;
  ElementDocument *pEVar4;
  reference pvVar5;
  pointer pEVar6;
  ElementPtr *this_00;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_68;
  const_iterator local_60;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *local_58;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_40;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_38;
  const_iterator local_30;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_28;
  ElementPtr element;
  int i;
  ElementDocument *document_local;
  Context *this_local;
  
  pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
  pEVar4 = (ElementDocument *)Element::GetFirstChild(pEVar3);
  if (document != pEVar4) {
    element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ = 0;
    while( true ) {
      iVar1 = element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
              super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
              super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_;
      pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         (&this->root);
      iVar2 = Element::GetNumChildren(pEVar3,false);
      if (iVar2 <= iVar1) break;
      pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                         (&this->root);
      pEVar4 = (ElementDocument *)
               Element::GetChild(pEVar3,element._M_t.
                                        super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                        .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl.
                                        _4_4_);
      if (pEVar4 == document) {
        this_00 = &this->root;
        pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_00);
        pvVar5 = ::std::
                 vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                 ::operator[](&pEVar3->children,
                              (long)element._M_t.
                                    super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                    .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_
                             );
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr(&local_28,pvVar5);
        pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_00);
        pEVar6 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_00);
        local_40._M_current =
             (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
             ::std::
             vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ::begin(&pEVar6->children);
        local_38 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                   ::operator+(&local_40,
                               (long)element._M_t.
                                     super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                     .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl.
                                     _4_4_);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
        ::__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>*>
                  ((__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
                    *)&local_30,&local_38);
        local_58 = (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                   ::std::
                   vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                   ::erase(&pEVar3->children,local_30);
        pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                           (&this->root);
        pEVar6 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                           (&this->root);
        local_68._M_current =
             (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
             ::std::
             vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ::begin(&pEVar6->children);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
        ::__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>*>
                  ((__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
                    *)&local_60,&local_68);
        ::std::
        vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
        ::insert(&pEVar3->children,local_60,&local_28);
        pEVar3 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->
                           (&this->root);
        Element::DirtyStackingContext(pEVar3);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_28);
      }
      element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ =
           element._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void Context::PushDocumentToBack(ElementDocument* document)
{
	if (document != root->GetFirstChild())
	{
		// See PullDocumentToFront().
		for (int i = 0; i < root->GetNumChildren(); ++i)
		{
			if (root->GetChild(i) == document)
			{
				ElementPtr element = std::move(root->children[i]);
				root->children.erase(root->children.begin() + i);
				root->children.insert(root->children.begin(), std::move(element));

				root->DirtyStackingContext();
			}
		}
	}
}